

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_fb33fd::GetIndexArg(string *arg,int *idx,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string msg;
  long value;
  string local_b0;
  string local_90;
  int local_70 [2];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  bVar1 = cmStrToLong(arg,(long *)local_70);
  if (!bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0121,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_90,(cmPolicies *)0x79,id);
      local_68._M_len = local_90._M_string_length;
      local_68._M_str = local_90._M_dataplus._M_p;
      local_58 = 0x15;
      local_50 = " Invalid list index \"";
      local_40 = (arg->_M_dataplus)._M_p;
      local_48 = arg->_M_string_length;
      local_38 = 2;
      local_30 = "\".";
      views_00._M_len = 4;
      views_00._M_array = &local_68;
      cmCatViews_abi_cxx11_(&local_b0,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_b0);
    }
    else {
      if (PVar2 == NEW) {
        return false;
      }
      if (PVar2 != WARN) goto LAB_0033326d;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_90,(cmPolicies *)0x79,id);
      local_68._M_len = local_90._M_string_length;
      local_68._M_str = local_90._M_dataplus._M_p;
      local_58 = 0x15;
      local_50 = " Invalid list index \"";
      local_40 = (arg->_M_dataplus)._M_p;
      local_48 = arg->_M_string_length;
      local_38 = 2;
      local_30 = "\".";
      views._M_len = 4;
      views._M_array = &local_68;
      cmCatViews_abi_cxx11_(&local_b0,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0033326d:
  *idx = local_70[0];
  return true;
}

Assistant:

bool GetIndexArg(const std::string& arg, int* idx, cmMakefile& mf)
{
  long value;
  if (!cmStrToLong(arg, &value)) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0121)) {
      case cmPolicies::WARN: {
        // Default is to warn and use old behavior OLD behavior is to allow
        // compatibility, so issue a warning and use the previous behavior.
        std::string warn =
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::AUTHOR_WARNING, warn);
        CM_FALLTHROUGH;
      }
      case cmPolicies::OLD:
        // OLD behavior is to allow compatibility, so just ignore the
        // situation.
        break;
      case cmPolicies::NEW:
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        std::string msg =
          cmStrCat(cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::FATAL_ERROR, msg);
        break;
    }
  }

  // Truncation is happening here, but it had always been happening here.
  *idx = static_cast<int>(value);

  return true;
}